

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_priority_change_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  native_handle_type nVar3;
  log_entry *this_00;
  pointer psVar4;
  _func_int *p_Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  element_type *peVar9;
  buffer *this_01;
  size_t sVar10;
  undefined8 uVar11;
  _func_int **pp_Var12;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  ptr<cluster_config> pVar14;
  undefined1 auVar15 [16];
  ptr<resp_msg> pVar16;
  ptr<cluster_config> c_conf;
  string local_60;
  _func_int **local_40;
  element_type *local_38;
  
  nVar3 = *(native_handle_type *)(in_RDX + 8);
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  peVar9 = (element_type *)operator_new(0xb0);
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar9->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b11c8;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar9->bg_commit_thread_)._M_id._M_thread = nVar3;
  *(undefined4 *)&(peVar9->bg_append_thread_)._M_id._M_thread = 0x19;
  *(undefined4 *)((long)&(peVar9->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar9->bg_append_ea_ = uVar1;
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005b1218;
  (peVar9->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->votes_responded_ = 0;
  peVar9->votes_granted_ = 0;
  (peVar9->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar9->priority_change_timer_).first_event_fired_ = 0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar9->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar9->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar9->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar9->field_0x31 = 0;
  peVar9->leader_ = (__atomic_base<int>)0x0;
  peVar9->id_ = 0;
  peVar9->my_priority_ = 0;
  *(undefined1 *)&peVar9->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var13._M_pi = extraout_RDX;
  if (*(undefined8 **)(in_RDX + 0x40) == *(undefined8 **)(in_RDX + 0x38)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_001c6c9e;
    iVar6 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var13._M_pi = extraout_RDX_03;
    if (iVar6 < 3) goto LAB_001c6c9e;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_60,"no log entry");
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
      ,"handle_priority_change_req",0xa2,&local_60);
    _Var13._M_pi = extraout_RDX_04;
  }
  else {
    this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38);
    if ((this_00->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar4 == (pointer)0x0) goto LAB_001c6c9e;
      iVar6 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var13._M_pi = extraout_RDX_05;
      if (iVar6 < 3) goto LAB_001c6c9e;
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_60,"empty buffer");
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xa6,&local_60);
      _Var13._M_pi = extraout_RDX_06;
    }
    else {
      this_01 = log_entry::get_buf(this_00);
      buffer::pos(this_01,0);
      sVar10 = buffer::size(this_01);
      if (7 < sVar10) {
        uVar7 = buffer::get_int(this_01);
        uVar8 = buffer::get_int(this_01);
        if (uVar7 == *(uint *)&(req->log_entries_).
                               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) {
          *(uint *)((long)&(req->log_entries_).
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) = uVar8;
        }
        pVar14 = get_config((raft_server *)&stack0xffffffffffffffc0);
        _Var13 = pVar14.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        pp_Var12 = local_40 + 7;
        do {
          pp_Var12 = (_func_int **)*pp_Var12;
          if (pp_Var12 == local_40 + 7) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (psVar4 != (pointer)0x0) {
              iVar6 = (*(code *)(psVar4->
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].buff_.
                                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)();
              _Var13._M_pi = extraout_RDX_11;
              if (2 < iVar6) {
                psVar4 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                msg_if_given_abi_cxx11_(&local_60,"cannot find peer %d",(ulong)uVar7);
                (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi)(psVar4,3,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                                  ,"handle_priority_change_req",0xc3,&local_60);
                _Var13._M_pi = extraout_RDX_12;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p);
                  _Var13._M_pi = extraout_RDX_13;
                }
              }
            }
            goto LAB_001c6c8f;
          }
          p_Var5 = pp_Var12[2];
        } while (*(uint *)p_Var5 != uVar7);
        auVar15 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
        _Var13._M_pi = auVar15._8_8_;
        uVar11 = auVar15._0_8_;
        peVar9->initialized_ = (atomic<bool>)(char)uVar11;
        *(int3 *)&peVar9->field_0x31 = (int3)((ulong)uVar11 >> 8);
        peVar9->leader_ = (atomic<int>)(int)((ulong)uVar11 >> 0x20);
        *(undefined1 *)&peVar9->target_priority_ = 1;
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar6 = (*(code *)(psVar4->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          _Var13._M_pi = extraout_RDX_08;
          if (3 < iVar6) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      (&local_60,"change peer %d priority: %d -> %d",(ulong)uVar7,
                       (ulong)*(uint *)(p_Var5 + 0x4c),(ulong)uVar8);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"handle_priority_change_req",0xbe,&local_60);
            _Var13._M_pi = extraout_RDX_09;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p);
              _Var13._M_pi = extraout_RDX_10;
            }
          }
        }
        *(uint *)(p_Var5 + 0x4c) = uVar8;
LAB_001c6c8f:
        if (local_38 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
          _Var13._M_pi = extraout_RDX_14;
        }
        goto LAB_001c6c9e;
      }
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var13._M_pi = extraout_RDX_00;
      if (psVar4 == (pointer)0x0) goto LAB_001c6c9e;
      iVar6 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var13._M_pi = extraout_RDX_01;
      if (iVar6 < 3) goto LAB_001c6c9e;
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar10 = buffer::size(this_01);
      msg_if_given_abi_cxx11_(&local_60,"wrong buffer size: %zu",sVar10);
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xad,&local_60);
      _Var13._M_pi = extraout_RDX_02;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    _Var13._M_pi = extraout_RDX_07;
  }
LAB_001c6c9e:
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_priority_change_req(req_msg& req) {
    // NOTE: now this function is protected by lock.
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::priority_change_response,
            id_,
            req.get_src() ) );

    std::vector< ptr<log_entry> >& v = req.log_entries();
    if (!v.size()) {
        p_wn("no log entry");
        return resp;
    }
    if (v[0]->is_buf_null()) {
        p_wn("empty buffer");
        return resp;
    }

    buffer& buf = v[0]->get_buf();
    buf.pos(0);
    if (buf.size() < sz_int * 2) {
        p_wn("wrong buffer size: %zu", buf.size());
        return resp;
    }

    int32 t_id = buf.get_int();
    int32 t_priority = buf.get_int();

    if (t_id == id_) {
        my_priority_ = t_priority;
    }

    ptr<cluster_config> c_conf = get_config();
    for (auto& entry: c_conf->get_servers()) {
        srv_config* s_conf = entry.get();
        if ( s_conf->get_id() == t_id ) {
            resp->accept(log_store_->next_slot());
            p_in("change peer %d priority: %d -> %d",
                 t_id, s_conf->get_priority(), t_priority);
            s_conf->set_priority(t_priority);
            return resp;
        }
    }
    p_wn("cannot find peer %d", t_id);

    return resp;
}